

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O2

int dsa_pub_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  int line;
  UniquePtr<DSA> key_00;
  int iVar1;
  DSA *__p;
  DSA *__p_00;
  BIGNUM *ret;
  UniquePtr<DSA> dsa;
  
  dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_dsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>)0x0;
  if (params->len == 0) {
    __p_00 = DSA_new();
    std::__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter> *)&dsa,(pointer)__p_00);
    if ((__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>)
        dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>)0x0) goto LAB_00163bfd;
LAB_00163c41:
    iVar1 = 0;
  }
  else {
    __p = DSA_parse_parameters(params);
    std::__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter> *)&dsa,__p);
    if (((__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>)
         dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl ==
         (__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>)0x0) || (params->len != 0)) {
      line = 0x28;
    }
    else {
LAB_00163bfd:
      ret = BN_new();
      *(BIGNUM **)
       ((long)dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl + 0x18) = ret;
      if (ret == (BIGNUM *)0x0) goto LAB_00163c41;
      iVar1 = BN_parse_asn1_unsigned(key,(BIGNUM *)ret);
      key_00 = dsa;
      if ((iVar1 != 0) && (key->len == 0)) {
        dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>)0x0;
        EVP_PKEY_assign_DSA(out,(DSA *)key_00._M_t.
                                       super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl);
        iVar1 = 1;
        goto LAB_00163c43;
      }
      line = 0x33;
    }
    iVar1 = 0;
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dsa_asn1.cc"
                  ,line);
  }
LAB_00163c43:
  std::unique_ptr<dsa_st,_bssl::internal::Deleter>::~unique_ptr(&dsa);
  return iVar1;
}

Assistant:

static int dsa_pub_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // See RFC 3279, section 2.3.2.

  // Parameters may or may not be present.
  bssl::UniquePtr<DSA> dsa;
  if (CBS_len(params) == 0) {
    dsa.reset(DSA_new());
    if (dsa == nullptr) {
      return 0;
    }
  } else {
    dsa.reset(DSA_parse_parameters(params));
    if (dsa == nullptr || CBS_len(params) != 0) {
      OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
      return 0;
    }
  }

  dsa->pub_key = BN_new();
  if (dsa->pub_key == nullptr) {
    return 0;
  }

  if (!BN_parse_asn1_unsigned(key, dsa->pub_key) || CBS_len(key) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  EVP_PKEY_assign_DSA(out, dsa.release());
  return 1;
}